

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptr.h
# Opt level: O2

void __thiscall
ut::shared_ptr<ut::setup_impl<agge::tests::RoundedRectangleTests>,_unsigned_int>::reset
          (shared_ptr<ut::setup_impl<agge::tests::RoundedRectangleTests>,_unsigned_int> *this)

{
  setup_impl<agge::tests::RoundedRectangleTests> *psVar1;
  uint *puVar2;
  
  puVar2 = this->_refcount;
  if ((puVar2 != (uint *)0x0) && (*puVar2 = *puVar2 - 1, *puVar2 == 0)) {
    psVar1 = this->_ptr;
    if (psVar1 != (setup_impl<agge::tests::RoundedRectangleTests> *)0x0) {
      (*(psVar1->super_destructible)._vptr_destructible[1])(psVar1);
      puVar2 = this->_refcount;
    }
    operator_delete(puVar2);
  }
  this->_ptr = (setup_impl<agge::tests::RoundedRectangleTests> *)0x0;
  this->_refcount = (uint *)0x0;
  return;
}

Assistant:

inline void shared_ptr<T, CounterT>::reset() throw()
	{
		enum {	unused = sizeof(T)	};
		if (_refcount && !--*_refcount)
			delete _ptr, delete _refcount;
		_ptr = 0, _refcount = 0;
	}